

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

void rescale(Mat *colorfulImage,Mat *image)

{
  int in_R8D;
  Size_<int> local_c8;
  _OutputArray local_c0;
  _InputArray local_a8;
  Size_<int> local_90;
  _OutputArray local_88;
  _InputArray local_70;
  _InputArray local_48;
  _InputArray local_30;
  Mat *local_18;
  Mat *image_local;
  Mat *colorfulImage_local;
  
  local_18 = image;
  image_local = colorfulImage;
  cv::_InputArray::_InputArray(&local_30,colorfulImage);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_48,local_18);
  cv::cvtColor((cv *)&local_30,&local_48,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_48);
  cv::_InputArray::~_InputArray(&local_30);
  while (600 < local_18->rows) {
    cv::_InputArray::_InputArray(&local_70,local_18);
    cv::_OutputArray::_OutputArray(&local_88,local_18);
    cv::Size_<int>::Size_(&local_90,local_18->cols / 2,local_18->rows / 2);
    cv::resize(0,&local_70,&local_88,&local_90,1);
    cv::_OutputArray::~_OutputArray(&local_88);
    cv::_InputArray::~_InputArray(&local_70);
    cv::_InputArray::_InputArray(&local_a8,image_local);
    cv::_OutputArray::_OutputArray(&local_c0,image_local);
    cv::Size_<int>::Size_(&local_c8,image_local->cols / 2,image_local->rows / 2);
    cv::resize(0,&local_a8,&local_c0,&local_c8,1);
    cv::_OutputArray::~_OutputArray(&local_c0);
    cv::_InputArray::~_InputArray(&local_a8);
  }
  return;
}

Assistant:

void rescale(Mat& colorfulImage, Mat& image){
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    // Shrink the image size
    while(image.rows > 600){
        resize(image, image, Size(image.cols/2,image.rows/2)); 
        resize(colorfulImage, colorfulImage, Size(colorfulImage.cols/2,colorfulImage.rows/2));
    }
}